

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O1

void * dowait(void *data)

{
  long lVar1;
  __pid_t _Var2;
  ssize_t sVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  if (0 < *(int *)((long)data + 0x10)) {
    lVar5 = 0x18;
    lVar6 = 0;
    do {
      lVar1 = *(long *)((long)data + 8);
      if (*(int *)(lVar1 + 4 + lVar5) == 0) {
        _Var2 = waitpid(*(__pid_t *)(lVar1 + -0x10 + lVar5),(int *)(lVar1 + lVar5),0);
        if (_Var2 < 0) {
          perror("waitpid");
          return (void *)0x0;
        }
        *(undefined4 *)(lVar1 + 4 + lVar5) = 1;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (lVar6 < *(int *)((long)data + 0x10));
  }
  if (-1 < *(int *)((long)data + 4)) {
    do {
      sVar3 = write(*(int *)((long)data + 4),"",1);
      if (sVar3 != -1) {
        return (void *)0x0;
      }
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  return (void *)0x0;
}

Assistant:

static void* dowait(void* data) {
  dowait_args* args = data;

  int i, r;
  process_info_t* p;

  for (i = 0; i < args->n; i++) {
    p = &args->vec[i];
    if (p->terminated) continue;
    r = waitpid(p->pid, &p->status, 0);
    if (r < 0) {
      perror("waitpid");
      return NULL;
    }
    p->terminated = 1;
  }

  if (args->pipe[1] >= 0) {
    /* Write a character to the main thread to notify it about this. */
    ssize_t r;

    do
      r = write(args->pipe[1], "", 1);
    while (r == -1 && errno == EINTR);
  }

  return NULL;
}